

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::clearEkkData(HEkk *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pHVar3;
  
  clearEkkDataInfo(this);
  this->model_status_ = kMin;
  this->simplex_in_scaled_space_ = false;
  HighsSparseMatrix::clear(&this->ar_matrix_);
  HighsSparseMatrix::clear(&this->scaled_a_matrix_);
  this->cost_scale_ = 1.0;
  this->iteration_count_ = 0;
  this->dual_simplex_cleanup_level_ = 0;
  this->dual_simplex_phase1_cleanup_level_ = 0;
  this->previous_iteration_cycling_detected = -0x7fffffff;
  this->solve_bailout_ = false;
  this->called_return_from_solve_ = false;
  this->exit_algorithm_ = kNone;
  this->return_primal_solution_status_ = 0;
  this->return_dual_solution_status_ = 0;
  piVar1 = (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  pdVar2 = (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  (this->dual_ray_record_).index = -1;
  (this->dual_ray_record_).sign = 0;
  pdVar2 = (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  (this->primal_ray_record_).index = -1;
  (this->primal_ray_record_).sign = 0;
  pdVar2 = (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  this->debug_max_relative_dual_steepest_edge_weight_error = 0.0;
  this->build_synthetic_tick_ = 0.0;
  this->total_synthetic_tick_ = 0.0;
  *(undefined8 *)((long)&this->total_synthetic_tick_ + 1) = 0;
  *(undefined8 *)((long)&this->debug_solve_call_num_ + 1) = 0;
  this->debug_initial_build_synthetic_tick_ = 0;
  this->debug_solve_report_ = false;
  this->debug_iteration_report_ = false;
  this->debug_basis_report_ = false;
  this->debug_dual_feasible = false;
  pHVar3 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->bad_basis_change_).
      super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar3) {
    (this->bad_basis_change_).
    super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ._M_impl.super__Vector_impl_data._M_finish = pHVar3;
  }
  pdVar2 = (this->primal_phase1_dual_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->primal_phase1_dual_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->primal_phase1_dual_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  return;
}

Assistant:

void HEkk::clearEkkData() {
  // Clears Ekk-specific data scalars and vectors. Doesn't clear
  // status, as this is done elsewhere
  //
  // Doesn't clear the LP, simplex NLA or simplex basis as part of
  // clearing Ekk data, so that the simplex basis and HFactor instance
  // are maintained
  //
  // analysis_; No clear yet

  this->clearEkkDataInfo();
  model_status_ = HighsModelStatus::kNotset;
  // random_; Has no data

  this->simplex_in_scaled_space_ = false;
  this->ar_matrix_.clear();
  this->scaled_a_matrix_.clear();

  this->cost_scale_ = 1;
  this->iteration_count_ = 0;
  this->dual_simplex_cleanup_level_ = 0;
  this->dual_simplex_phase1_cleanup_level_ = 0;

  this->previous_iteration_cycling_detected = -kHighsIInf;

  this->solve_bailout_ = false;
  this->called_return_from_solve_ = false;
  this->exit_algorithm_ = SimplexAlgorithm::kNone;
  this->return_primal_solution_status_ = 0;
  this->return_dual_solution_status_ = 0;

  this->proof_index_.clear();
  this->proof_value_.clear();

  this->clearRayRecords();

  this->build_synthetic_tick_ = 0.0;
  this->total_synthetic_tick_ = 0.0;

  // Clear values used for debugging
  this->debug_solve_call_num_ = 0;
  this->debug_basis_id_ = 0;
  this->time_report_ = false;
  this->debug_initial_build_synthetic_tick_ = 0;
  this->debug_solve_report_ = false;
  this->debug_iteration_report_ = false;
  this->debug_basis_report_ = false;
  this->debug_dual_feasible = false;
  this->debug_max_relative_dual_steepest_edge_weight_error = 0;

  clearBadBasisChange();

  this->primal_phase1_dual_.clear();
}